

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdldl_interface.c
# Opt level: O1

void free_linsys_solver_qdldl(qdldl_solver *s)

{
  if (s != (qdldl_solver *)0x0) {
    if (s->L != (csc *)0x0) {
      csc_spfree(s->L);
    }
    if (s->P != (c_int *)0x0) {
      free(s->P);
    }
    if (s->Dinv != (c_float *)0x0) {
      free(s->Dinv);
    }
    if (s->bp != (c_float *)0x0) {
      free(s->bp);
    }
    if (s->sol != (c_float *)0x0) {
      free(s->sol);
    }
    if (s->rho_inv_vec != (c_float *)0x0) {
      free(s->rho_inv_vec);
    }
    if (s->Pdiag_idx != (c_int *)0x0) {
      free(s->Pdiag_idx);
    }
    if (s->KKT != (csc *)0x0) {
      csc_spfree(s->KKT);
    }
    if (s->PtoKKT != (c_int *)0x0) {
      free(s->PtoKKT);
    }
    if (s->AtoKKT != (c_int *)0x0) {
      free(s->AtoKKT);
    }
    if (s->rhotoKKT != (c_int *)0x0) {
      free(s->rhotoKKT);
    }
    if (s->D != (QDLDL_float *)0x0) {
      free(s->D);
    }
    if (s->etree != (QDLDL_int *)0x0) {
      free(s->etree);
    }
    if (s->Lnz != (QDLDL_int *)0x0) {
      free(s->Lnz);
    }
    if (s->iwork != (QDLDL_int *)0x0) {
      free(s->iwork);
    }
    if (s->bwork != (QDLDL_bool *)0x0) {
      free(s->bwork);
    }
    if (s->fwork != (QDLDL_float *)0x0) {
      free(s->fwork);
    }
    free(s);
    return;
  }
  return;
}

Assistant:

void free_linsys_solver_qdldl(qdldl_solver *s) {
    if (s) {
        if (s->L)           csc_spfree(s->L);
        if (s->P)           c_free(s->P);
        if (s->Dinv)        c_free(s->Dinv);
        if (s->bp)          c_free(s->bp);
        if (s->sol)         c_free(s->sol);
        if (s->rho_inv_vec) c_free(s->rho_inv_vec);

        // These are required for matrix updates
        if (s->Pdiag_idx) c_free(s->Pdiag_idx);
        if (s->KKT)       csc_spfree(s->KKT);
        if (s->PtoKKT)    c_free(s->PtoKKT);
        if (s->AtoKKT)    c_free(s->AtoKKT);
        if (s->rhotoKKT)  c_free(s->rhotoKKT);

        // QDLDL workspace
        if (s->D)         c_free(s->D);
        if (s->etree)     c_free(s->etree);
        if (s->Lnz)       c_free(s->Lnz);
        if (s->iwork)     c_free(s->iwork);
        if (s->bwork)     c_free(s->bwork);
        if (s->fwork)     c_free(s->fwork);
        c_free(s);

    }
}